

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O1

void __thiscall absl::lts_20240722::flags_internal::FlagImpl::Init(FlagImpl *this)

{
  FlagDfltGenFunc p_Var1;
  byte bVar2;
  void *pvVar3;
  atomic<unsigned_long> *paVar4;
  atomic<absl::lts_20240722::flags_internal::MaskedPointer> *paVar5;
  atomic<long> *paVar6;
  uint uVar7;
  ptr_t rhs;
  array<char,_8UL> buf;
  __atomic_base<long> local_30;
  atomic<absl::lts_20240722::flags_internal::MaskedPointer> local_28;
  
  this->data_guard_[0] = '\0';
  this->data_guard_[1] = '\0';
  this->data_guard_[2] = '\0';
  this->data_guard_[3] = '\0';
  this->data_guard_[4] = '\0';
  this->data_guard_[5] = '\0';
  this->data_guard_[6] = '\0';
  this->data_guard_[7] = '\0';
  bVar2 = this->field_0x29 & 3;
  uVar7 = *(uint *)&this->field_0x28 >> 1 & 3;
  if (uVar7 < 2) {
    local_30._M_i = 0;
    if (bVar2 == 1) {
      (*(this->default_value_).gen_func)(&local_30);
    }
    else {
      if ((this->field_0x29 & 3) == 0) {
        __assert_fail("def_kind != FlagDefaultKind::kDynamicValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/flags/internal/flag.cc"
                      ,0xcf,"void absl::flags_internal::FlagImpl::Init()");
      }
      pvVar3 = (*this->op_)(kSizeof,(void *)0x0,(void *)0x0,(void *)0x0);
      memcpy(&local_30,&this->default_value_,(size_t)pvVar3);
    }
    if ((this->field_0x28 & 6) == 0) {
      pvVar3 = (*this->op_)(kSizeof,(void *)0x0,(void *)0x0,(void *)0x0);
      *(undefined1 *)((long)&local_30._M_i + (long)pvVar3) = 1;
    }
    paVar6 = OneWordValue(this);
    (paVar6->super___atomic_base<long>)._M_i = local_30._M_i;
  }
  else if (uVar7 == 2) {
    if (bVar2 != 1) {
      __assert_fail("def_kind == FlagDefaultKind::kGenFunc",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/flags/internal/flag.cc"
                    ,0xe1,"void absl::flags_internal::FlagImpl::Init()");
    }
    p_Var1 = (this->default_value_).gen_func;
    paVar4 = AtomicBufferValue(this);
    (*p_Var1)(paVar4);
  }
  else {
    if (bVar2 != 1) {
      __assert_fail("def_kind == FlagDefaultKind::kGenFunc",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/flags/internal/flag.cc"
                    ,0xe8,"void absl::flags_internal::FlagImpl::Init()");
    }
    paVar5 = PtrStorage(this);
    rhs = (ptr_t)((ulong)(paVar5->_M_i).ptr_ & 0xfffffffffffffffc);
    (*(this->default_value_).gen_func)(rhs);
    paVar5 = PtrStorage(this);
    MaskedPointer::MaskedPointer(&local_28._M_i,rhs,true);
    (paVar5->_M_i).ptr_ = (ptr_t)local_28._M_i.ptr_;
  }
  if ((this->seq_lock_).lock_.super___atomic_base<long>._M_i == -1) {
    (this->seq_lock_).lock_.super___atomic_base<long>._M_i = 0;
    return;
  }
  __assert_fail("lock_.load(std::memory_order_relaxed) == kUninitialized",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/flags/internal/sequence_lock.h"
                ,0x40,"void absl::flags_internal::SequenceLock::MarkInitialized()");
}

Assistant:

void FlagImpl::Init() {
  new (&data_guard_) absl::Mutex;

  auto def_kind = static_cast<FlagDefaultKind>(def_kind_);

  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic: {
      alignas(int64_t) std::array<char, sizeof(int64_t)> buf{};
      if (def_kind == FlagDefaultKind::kGenFunc) {
        (*default_value_.gen_func)(buf.data());
      } else {
        assert(def_kind != FlagDefaultKind::kDynamicValue);
        std::memcpy(buf.data(), &default_value_, Sizeof(op_));
      }
      if (ValueStorageKind() == FlagValueStorageKind::kValueAndInitBit) {
        // We presume here the memory layout of FlagValueAndInitBit struct.
        uint8_t initialized = 1;
        std::memcpy(buf.data() + Sizeof(op_), &initialized,
                    sizeof(initialized));
      }
      // Type can contain valid uninitialized bits, e.g. padding.
      ABSL_ANNOTATE_MEMORY_IS_INITIALIZED(buf.data(), buf.size());
      OneWordValue().store(absl::bit_cast<int64_t>(buf),
                           std::memory_order_release);
      break;
    }
    case FlagValueStorageKind::kSequenceLocked: {
      // For this storage kind the default_value_ always points to gen_func
      // during initialization.
      assert(def_kind == FlagDefaultKind::kGenFunc);
      (*default_value_.gen_func)(AtomicBufferValue());
      break;
    }
    case FlagValueStorageKind::kHeapAllocated:
      // For this storage kind the default_value_ always points to gen_func
      // during initialization.
      assert(def_kind == FlagDefaultKind::kGenFunc);
      // Flag value initially points to the internal buffer.
      MaskedPointer ptr_value = PtrStorage().load(std::memory_order_acquire);
      (*default_value_.gen_func)(ptr_value.Ptr());
      // Default value is a candidate for an unprotected read.
      PtrStorage().store(MaskedPointer(ptr_value.Ptr(), true),
                         std::memory_order_release);
      break;
  }
  seq_lock_.MarkInitialized();
}